

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::OperatorMultiplyFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  PhysicalType PVar1;
  pointer pSVar2;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  LogicalType varargs_02;
  LogicalType varargs_03;
  bool bVar3;
  NotImplementedException *this_00;
  PhysicalType type;
  ScalarFunction *func;
  pointer function_00;
  undefined8 *puVar4;
  ScalarFunctionSet *in_RDI;
  bind_scalar_function_t *pp_Var5;
  LogicalType *other;
  long lVar6;
  byte bVar7;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  ScalarFunction function;
  undefined4 in_stack_fffffffffffff514;
  undefined4 in_stack_fffffffffffff51c;
  FunctionNullHandling null_handling;
  ScalarFunctionSet *pSVar8;
  bind_lambda_function_t in_stack_fffffffffffff530;
  undefined1 local_ac8 [24];
  LogicalType local_ab0;
  _Any_data local_a98;
  code *local_a88;
  undefined8 uStack_a80;
  vector<duckdb::ScalarFunction,_true> *local_a70;
  _Any_data *local_a68;
  _Any_data *local_a60;
  scalar_function_t local_a58;
  scalar_function_t local_a38;
  _Any_data *local_a18;
  _Any_data *local_a10;
  bind_scalar_function_t *local_a08;
  undefined8 *local_a00;
  _func_int **local_9f8;
  LogicalType *local_9f0;
  LogicalType *local_9e8;
  LogicalType *local_9e0;
  _Any_data local_9d8;
  code *local_9c8;
  undefined8 uStack_9c0;
  LogicalType *local_9b0;
  LogicalType *local_9a8;
  _Any_data local_998;
  code *local_988;
  LogicalType local_978;
  vector<duckdb::LogicalType,_true> local_960;
  LogicalType local_948;
  vector<duckdb::LogicalType,_true> local_930;
  LogicalType local_918;
  vector<duckdb::LogicalType,_true> local_900;
  LogicalType local_8e8;
  vector<duckdb::LogicalType,_true> local_8d0;
  LogicalType local_8b8;
  LogicalType local_8a0;
  LogicalType local_888;
  LogicalType local_870;
  undefined1 local_858 [144];
  LogicalType LStack_7c8;
  FunctionStability local_7b0;
  FunctionNullHandling FStack_7af;
  FunctionErrors FStack_7ae;
  FunctionCollationHandling FStack_7ad;
  _Any_data _Stack_7a8;
  _Manager_type local_798;
  undefined8 auStack_788 [7];
  code *local_750;
  code *local_748;
  element_type *local_740;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_738;
  string local_730;
  string local_710;
  LogicalType local_6f0;
  LogicalType local_6d8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_6c0 [24];
  ScalarFunction local_6a8;
  ScalarFunction local_580;
  ScalarFunction local_458;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  bVar7 = 0;
  local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_730,anon_var_dwarf_4ed1a7a + 8,anon_var_dwarf_4ed1a7a + 9);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_730);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730._M_dataplus._M_p != &local_730.field_2) {
    operator_delete(local_730._M_dataplus._M_p);
  }
  LogicalType::Numeric();
  local_9e0 = local_9a8;
  if (local_9b0 != local_9a8) {
    local_a18 = (_Any_data *)&local_330.function;
    local_a10 = (_Any_data *)&local_208.function;
    local_9f0 = &local_6a8.super_BaseScalarFunction.return_type;
    local_9e8 = &LStack_7c8;
    local_a60 = (_Any_data *)&local_6a8.function;
    local_a68 = &_Stack_7a8;
    local_a08 = &local_6a8.bind;
    local_a00 = auStack_788;
    local_9f8 = (_func_int **)&PTR__BaseScalarFunction_0243ff60;
    local_a70 = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
    other = local_9b0;
    do {
      if (other->id_ == DECIMAL) {
        LogicalType::LogicalType((LogicalType *)local_ac8,other);
        LogicalType::LogicalType((LogicalType *)(local_ac8 + 0x18),other);
        __l._M_len = 2;
        __l._M_array = (iterator)local_ac8;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (local_6c0,__l,(allocator_type *)&local_710);
        LogicalType::LogicalType(&local_8b8,other);
        local_9c8 = (code *)0x0;
        uStack_9c0 = 0;
        local_9d8._M_unused._M_object = (void *)0x0;
        local_9d8._8_8_ = 0;
        LogicalType::LogicalType(&local_6d8,INVALID);
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs._0_8_ = &local_6d8;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_fffffffffffff514;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_fffffffffffff51c;
        ScalarFunction::ScalarFunction
                  ((ScalarFunction *)local_858,(vector<duckdb::LogicalType,_true> *)local_6c0,
                   &local_8b8,(scalar_function_t *)&local_9d8,BindDecimalMultiply,
                   (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                   (init_local_state_t)0x0,varargs,CONSISTENT,(FunctionNullHandling)in_RDI,
                   in_stack_fffffffffffff530);
        LogicalType::~LogicalType(&local_6d8);
        if (local_9c8 != (code *)0x0) {
          (*local_9c8)(&local_9d8,&local_9d8,__destroy_functor);
        }
        LogicalType::~LogicalType(&local_8b8);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(local_6c0)
        ;
        lVar6 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(local_ac8 + lVar6));
          lVar6 = lVar6 + -0x18;
        } while (lVar6 != -0x18);
        local_750 = SerializeDecimalArithmetic;
        local_748 = 
        DeserializeDecimalArithmetic<duckdb::MultiplyOperator,duckdb::DecimalMultiplyOverflowCheck,false>
        ;
        SimpleFunction::SimpleFunction((SimpleFunction *)&local_6a8,(SimpleFunction *)local_858);
        local_6a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             local_9f8;
        LogicalType::LogicalType(local_9f0,local_9e8);
        local_6a8.super_BaseScalarFunction.stability = local_7b0;
        local_6a8.super_BaseScalarFunction.null_handling = FStack_7af;
        local_6a8.super_BaseScalarFunction.errors = FStack_7ae;
        local_6a8.super_BaseScalarFunction.collation_handling = FStack_7ad;
        local_6a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_02433f30;
        ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
        function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  *)local_a60,
                 (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  *)local_a68);
        puVar4 = local_a00;
        pp_Var5 = local_a08;
        for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
          *pp_Var5 = (bind_scalar_function_t)*puVar4;
          puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
          pp_Var5 = pp_Var5 + (ulong)bVar7 * -2 + 1;
        }
        local_6a8.function_info.internal.
        super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_740;
        local_6a8.function_info.internal.
        super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = local_738._M_pi;
        if (local_738._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_738._M_pi)->_M_use_count = (local_738._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_738._M_pi)->_M_use_count = (local_738._M_pi)->_M_use_count + 1;
          }
        }
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  (&local_a70->
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_6a8);
        local_6a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_02433f30;
        if (local_6a8.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_6a8.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_6a8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_6a8.function.super__Function_base._M_manager)
                    (local_a60,local_a60,__destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction(&local_6a8.super_BaseScalarFunction);
        local_858._0_8_ = &PTR__ScalarFunction_02433f30;
        if (local_738._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_738._M_pi);
        }
        if (local_798 != (_Manager_type)0x0) {
          (*local_798)(local_a68,local_a68,__destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_858);
      }
      else {
        bVar3 = TypeIsIntegral(other->physical_type_);
        if (!bVar3) {
          LogicalType::LogicalType((LogicalType *)local_858,other);
          LogicalType::LogicalType((LogicalType *)(local_858 + 0x18),other);
          __l_01._M_len = 2;
          __l_01._M_array = (iterator)local_858;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_900
                     ,__l_01,(allocator_type *)local_ac8);
          LogicalType::LogicalType(&local_918,other);
          GetScalarBinaryFunction<duckdb::MultiplyOperator>
                    ((scalar_function_t *)&local_998,other->physical_type_);
          LogicalType::LogicalType(&local_870,INVALID);
          varargs_00.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
          varargs_00._0_8_ = &local_870;
          varargs_00.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
               in_stack_fffffffffffff514;
          varargs_00.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 0;
          varargs_00.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = in_stack_fffffffffffff51c;
          ScalarFunction::ScalarFunction
                    (&local_330,&local_900,&local_918,(scalar_function_t *)&local_998,
                     (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                     (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
                     (FunctionNullHandling)in_RDI,in_stack_fffffffffffff530);
          ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
          emplace_back<duckdb::ScalarFunction>
                    (&local_a70->
                      super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                     &local_330);
          local_330.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
               (_func_int **)&PTR__ScalarFunction_02433f30;
          if (local_330.function_info.internal.
              super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_330.function_info.internal.
                       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_330.function.super__Function_base._M_manager)
                      (local_a18,local_a18,__destroy_functor);
          }
          BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
          LogicalType::~LogicalType(&local_870);
          if (local_988 != (code *)0x0) {
            (*local_988)(&local_998,&local_998,__destroy_functor);
          }
          LogicalType::~LogicalType(&local_918);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_900
                    );
          lVar6 = 0x18;
          do {
            LogicalType::~LogicalType((LogicalType *)(local_858 + lVar6));
            lVar6 = lVar6 + -0x18;
          } while (lVar6 != -0x18);
          goto LAB_010497c6;
        }
        LogicalType::LogicalType((LogicalType *)local_858,other);
        LogicalType::LogicalType((LogicalType *)(local_858 + 0x18),other);
        __l_00._M_len = 2;
        __l_00._M_array = (iterator)local_858;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_8d0,
                   __l_00,(allocator_type *)&stack0xfffffffffffff537);
        LogicalType::LogicalType(&local_8e8,other);
        PVar1 = other->physical_type_;
        local_a98._M_unused._M_object = (void *)0x0;
        local_a98._8_8_ = 0;
        local_a88 = (code *)0x0;
        uStack_a80 = 0;
        switch(PVar1) {
        case UINT8:
          local_ac8._0_8_ =
               ScalarFunction::
               BinaryFunction<unsigned_char,unsigned_char,unsigned_char,duckdb::MultiplyOperatorOverflowCheck>
          ;
          break;
        case INT8:
          local_ac8._0_8_ =
               ScalarFunction::
               BinaryFunction<signed_char,signed_char,signed_char,duckdb::MultiplyOperatorOverflowCheck>
          ;
          break;
        case UINT16:
          local_ac8._0_8_ =
               ScalarFunction::
               BinaryFunction<unsigned_short,unsigned_short,unsigned_short,duckdb::MultiplyOperatorOverflowCheck>
          ;
          break;
        case INT16:
          local_ac8._0_8_ =
               ScalarFunction::
               BinaryFunction<short,short,short,duckdb::MultiplyOperatorOverflowCheck>;
          break;
        case UINT32:
          local_ac8._0_8_ =
               ScalarFunction::
               BinaryFunction<unsigned_int,unsigned_int,unsigned_int,duckdb::MultiplyOperatorOverflowCheck>
          ;
          break;
        case INT32:
          local_ac8._0_8_ =
               ScalarFunction::BinaryFunction<int,int,int,duckdb::MultiplyOperatorOverflowCheck>;
          break;
        case UINT64:
          local_ac8._0_8_ =
               ScalarFunction::
               BinaryFunction<unsigned_long,unsigned_long,unsigned_long,duckdb::MultiplyOperatorOverflowCheck>
          ;
          break;
        case INT64:
          local_ac8._0_8_ =
               ScalarFunction::BinaryFunction<long,long,long,duckdb::MultiplyOperatorOverflowCheck>;
          break;
        default:
          if (PVar1 == UINT128) {
            local_ac8._0_8_ =
                 ScalarFunction::
                 BinaryFunction<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::MultiplyOperatorOverflowCheck>
            ;
          }
          else {
            if (PVar1 != INT128) {
              this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
              local_ac8._0_8_ = local_ac8 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_ac8,"Unimplemented type for GetScalarBinaryFunction: %s",""
                        );
              TypeIdToString_abi_cxx11_(&local_710,(duckdb *)(ulong)PVar1,type);
              NotImplementedException::NotImplementedException<std::__cxx11::string>
                        (this_00,(string *)local_ac8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_710);
              __cxa_throw(this_00,&NotImplementedException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            local_ac8._0_8_ =
                 ScalarFunction::
                 BinaryFunction<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::MultiplyOperatorOverflowCheck>
            ;
          }
          ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
          operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                    local_a98._M_pod_data,
                    (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)local_ac8);
          goto LAB_010496be;
        }
        ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
        operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                  local_a98._M_pod_data,
                  (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)local_ac8);
LAB_010496be:
        LogicalType::LogicalType(&local_6f0,INVALID);
        varargs_01.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs_01._0_8_ = &local_6f0;
        varargs_01.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_fffffffffffff514;
        varargs_01.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs_01.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_fffffffffffff51c;
        ScalarFunction::ScalarFunction
                  (&local_208,&local_8d0,&local_8e8,(scalar_function_t *)&local_a98,
                   (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                   PropagateNumericStats<duckdb::TryMultiplyOperator,duckdb::MultiplyPropagateStatistics,duckdb::MultiplyOperator>
                   ,(init_local_state_t)0x0,varargs_01,CONSISTENT,(FunctionNullHandling)in_RDI,
                   in_stack_fffffffffffff530);
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  (&local_a70->
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_208);
        local_208.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_02433f30;
        if (local_208.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_208.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_208.function.super__Function_base._M_manager)
                    (local_a10,local_a10,__destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
        LogicalType::~LogicalType(&local_6f0);
        if (local_a88 != (code *)0x0) {
          (*local_a88)(&local_a98,&local_a98,__destroy_functor);
        }
        LogicalType::~LogicalType(&local_8e8);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_8d0);
        lVar6 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(local_858 + lVar6));
          lVar6 = lVar6 + -0x18;
        } while (lVar6 != -0x18);
      }
LAB_010497c6:
      other = other + 1;
    } while (other != local_9e0);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_9b0);
  LogicalType::LogicalType((LogicalType *)local_858,INTERVAL);
  pSVar8 = in_RDI;
  LogicalType::LogicalType((LogicalType *)(local_858 + 0x18),DOUBLE);
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_858;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_930,__l_02,
             (allocator_type *)local_ac8);
  LogicalType::LogicalType(&local_948,INTERVAL);
  local_a38.super__Function_base._M_functor._8_8_ = 0;
  local_a38.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::
       BinaryFunction<duckdb::interval_t,double,duckdb::interval_t,duckdb::MultiplyOperator>;
  local_a38._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_a38.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_888,INVALID);
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_02._0_8_ = &local_888;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff514;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff51c;
  ScalarFunction::ScalarFunction
            (&local_458,&local_930,&local_948,&local_a38,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_02,CONSISTENT,(FunctionNullHandling)pSVar8,in_stack_fffffffffffff530);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_458);
  local_458.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02433f30;
  if (local_458.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_458.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_458.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_458.function.super__Function_base._M_manager)
              ((_Any_data *)&local_458.function,(_Any_data *)&local_458.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_458.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_888);
  if (local_a38.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a38.super__Function_base._M_manager)
              ((_Any_data *)&local_a38,(_Any_data *)&local_a38,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_948);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_930);
  lVar6 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_858 + lVar6));
    null_handling = (FunctionNullHandling)pSVar8;
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  LogicalType::LogicalType((LogicalType *)local_858,BIGINT);
  LogicalType::LogicalType((LogicalType *)(local_858 + 0x18),INTERVAL);
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)local_858;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_960,__l_03,
             (allocator_type *)local_ac8);
  LogicalType::LogicalType(&local_978,INTERVAL);
  local_a58.super__Function_base._M_functor._8_8_ = 0;
  local_a58.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::
       BinaryFunction<long,duckdb::interval_t,duckdb::interval_t,duckdb::MultiplyOperator>;
  local_a58._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_a58.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_8a0,INVALID);
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_03._0_8_ = &local_8a0;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff514;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff51c;
  ScalarFunction::ScalarFunction
            (&local_580,&local_960,&local_978,&local_a58,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_03,CONSISTENT,null_handling,in_stack_fffffffffffff530);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_580);
  local_580.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02433f30;
  if (local_580.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_580.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_580.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_580.function.super__Function_base._M_manager)
              ((_Any_data *)&local_580.function,(_Any_data *)&local_580.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_580.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_8a0);
  if (local_a58.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a58.super__Function_base._M_manager)
              ((_Any_data *)&local_a58,(_Any_data *)&local_a58,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_978);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_960);
  lVar6 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_858 + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  function_00 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                _M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (function_00 != pSVar2) {
    do {
      BaseScalarFunction::SetReturnsError(&local_e0,&function_00->super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_e0);
      function_00 = function_00 + 1;
    } while (function_00 != pSVar2);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet OperatorMultiplyFun::GetFunctions() {
	ScalarFunctionSet multiply("*");
	for (auto &type : LogicalType::Numeric()) {
		if (type.id() == LogicalTypeId::DECIMAL) {
			ScalarFunction function({type, type}, type, nullptr, BindDecimalMultiply);
			function.serialize = SerializeDecimalArithmetic;
			function.deserialize = DeserializeDecimalArithmetic<MultiplyOperator, DecimalMultiplyOverflowCheck>;
			multiply.AddFunction(function);
		} else if (TypeIsIntegral(type.InternalType())) {
			multiply.AddFunction(ScalarFunction(
			    {type, type}, type, GetScalarIntegerFunction<MultiplyOperatorOverflowCheck>(type.InternalType()),
			    nullptr, nullptr,
			    PropagateNumericStats<TryMultiplyOperator, MultiplyPropagateStatistics, MultiplyOperator>));
		} else {
			multiply.AddFunction(
			    ScalarFunction({type, type}, type, GetScalarBinaryFunction<MultiplyOperator>(type.InternalType())));
		}
	}
	multiply.AddFunction(
	    ScalarFunction({LogicalType::INTERVAL, LogicalType::DOUBLE}, LogicalType::INTERVAL,
	                   ScalarFunction::BinaryFunction<interval_t, double, interval_t, MultiplyOperator>));
	multiply.AddFunction(
	    ScalarFunction({LogicalType::BIGINT, LogicalType::INTERVAL}, LogicalType::INTERVAL,
	                   ScalarFunction::BinaryFunction<int64_t, interval_t, interval_t, MultiplyOperator>));
	for (auto &func : multiply.functions) {
		ScalarFunction::SetReturnsError(func);
	}

	return multiply;
}